

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O0

void printFlagBits(uint32_t flags,_func_char_ptr_uint32_t__Bool *toStringFn)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  code *in_RSI;
  uint in_EDI;
  bool bVar4;
  char *str;
  char *comma;
  _Bool bit_value;
  uint32_t bit_mask;
  uint32_t bit_index;
  _Bool first;
  uint local_18;
  char local_11;
  
  local_11 = '\x01';
  for (local_18 = 0; local_18 < 0x20; local_18 = local_18 + 1) {
    uVar1 = 1 << ((byte)local_18 & 0x1f);
    bVar4 = (uVar1 & in_EDI) != 0;
    pcVar2 = ", ";
    if (local_11 != '\0') {
      pcVar2 = "";
    }
    lVar3 = (*in_RSI)(local_18,bVar4,local_11,CONCAT71(0x6a46,bVar4));
    if (lVar3 == 0) {
      if (bVar4) {
        printf("%s%u",pcVar2,(ulong)uVar1);
        local_11 = '\0';
      }
    }
    else {
      printf("%s%s",pcVar2,lVar3);
      local_11 = '\0';
    }
  }
  return;
}

Assistant:

static void printFlagBits(uint32_t flags, const char*(*toStringFn)(uint32_t, bool)) {
    bool first = true;
    for (uint32_t bit_index = 0; bit_index < 32; ++bit_index) {
        uint32_t bit_mask = 1u << bit_index;
        bool bit_value = (bit_mask & (uint32_t) flags) != 0;

        const char* comma = first ? "" : ", ";
        const char* str = toStringFn(bit_index, bit_value);
        if (str) {
            printf("%s%s", comma, str);
            first = false;
        } else if (bit_value) {
            printf("%s%u", comma, bit_mask);
            first = false;
        }
    }
}